

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O2

void Eigen::internal::
     Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Product<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>,_Eigen::internal::add_assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
     ::run(Matrix<double,__1,_1,_0,__1,_1> *dst,SrcXprType *src,
          add_assign_op<double,_double> *param_3)

{
  if ((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
      (src->m_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
  {
    generic_product_impl<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>,Eigen::DenseShape,Eigen::DenseShape,3>
    ::addTo<Eigen::Matrix<double,_1,1,0,_1,1>>(dst,src->m_lhs,&src->m_rhs);
    return;
  }
  __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/ProductEvaluators.h"
                ,0xa1,
                "static void Eigen::internal::Assignment<Eigen::Matrix<double, -1, 1>, Eigen::Product<Eigen::Matrix<double, -1, 1>, Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>, Eigen::internal::add_assign_op<double, double>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Product<Eigen::Matrix<double, -1, 1>, Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>, Functor = Eigen::internal::add_assign_op<double, double>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
               );
}

Assistant:

void run(DstXprType &dst, const SrcXprType &src, const internal::add_assign_op<Scalar,Scalar> &)
  {
    eigen_assert(dst.rows() == src.rows() && dst.cols() == src.cols());
    // FIXME shall we handle nested_eval here?
    generic_product_impl<Lhs, Rhs>::addTo(dst, src.lhs(), src.rhs());
  }